

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_sle(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  uint32_t uVar1;
  TCGv_i64 ret;
  TCGv_i64 ret_00;
  TCGv_i64 t1;
  TCGv_i64 t0;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  ret = tcg_temp_new_i64(tcg_ctx_00);
  ret_00 = tcg_temp_new_i64(tcg_ctx_00);
  uVar1 = rB(ctx->opcode);
  tcg_gen_andi_i64_ppc64(tcg_ctx_00,ret_00,cpu_gpr[uVar1],0x1f);
  uVar1 = rS(ctx->opcode);
  tcg_gen_shl_i64_ppc64(tcg_ctx_00,ret,cpu_gpr[uVar1],ret_00);
  tcg_gen_subfi_i64_ppc64(tcg_ctx_00,ret_00,0x20,ret_00);
  uVar1 = rS(ctx->opcode);
  tcg_gen_shr_i64_ppc64(tcg_ctx_00,ret_00,cpu_gpr[uVar1],ret_00);
  tcg_gen_or_i64_ppc64(tcg_ctx_00,ret_00,ret,ret_00);
  uVar1 = rA(ctx->opcode);
  tcg_gen_mov_i64_ppc64(tcg_ctx_00,cpu_gpr[uVar1],ret);
  gen_store_spr(tcg_ctx_00,0,ret_00);
  tcg_temp_free_i64(tcg_ctx_00,ret);
  tcg_temp_free_i64(tcg_ctx_00,ret_00);
  uVar1 = Rc(ctx->opcode);
  if (uVar1 != 0) {
    uVar1 = rA(ctx->opcode);
    gen_set_Rc0(ctx,cpu_gpr[uVar1]);
  }
  return;
}

Assistant:

static void gen_sle(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0 = tcg_temp_new(tcg_ctx);
    TCGv t1 = tcg_temp_new(tcg_ctx);
    tcg_gen_andi_tl(tcg_ctx, t1, cpu_gpr[rB(ctx->opcode)], 0x1F);
    tcg_gen_shl_tl(tcg_ctx, t0, cpu_gpr[rS(ctx->opcode)], t1);
    tcg_gen_subfi_tl(tcg_ctx, t1, 32, t1);
    tcg_gen_shr_tl(tcg_ctx, t1, cpu_gpr[rS(ctx->opcode)], t1);
    tcg_gen_or_tl(tcg_ctx, t1, t0, t1);
    tcg_gen_mov_tl(tcg_ctx, cpu_gpr[rA(ctx->opcode)], t0);
    gen_store_spr(tcg_ctx, SPR_MQ, t1);
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
    if (unlikely(Rc(ctx->opcode) != 0)) {
        gen_set_Rc0(ctx, cpu_gpr[rA(ctx->opcode)]);
    }
}